

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

void __thiscall
crnlib::crn_comp::optimize_color_endpoints_task(crn_comp *this,uint64 data,void *pData_ptr)

{
  uint8 *puVar1;
  int *piVar2;
  float fVar3;
  uint8 uVar4;
  ushort uVar5;
  ushort uVar6;
  vector<unsigned_short> *remapping;
  level_details *plVar7;
  endpoint_indices_details *peVar8;
  bool bVar9;
  undefined8 uVar10;
  unsigned_short uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint16 i;
  ulong uVar15;
  ulong uVar16;
  byte bVar17;
  uint uVar18;
  uint uVar19;
  uint16 i_3;
  int iVar20;
  uint min_new_capacity;
  byte bVar21;
  vector<unsigned_char> *packed_data;
  byte bVar22;
  ulong uVar23;
  uint8 uVar24;
  byte bVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  uint i_1;
  int iVar29;
  ulong uVar30;
  uint uVar31;
  bool bVar32;
  vector<unsigned_int> hist;
  static_huffman_data_model dm;
  symbol_codec codec;
  ushort local_1b6;
  byte local_1b4;
  byte local_1b3;
  byte local_1b2;
  byte local_1b1;
  byte local_1b0;
  byte local_1af;
  byte local_1ae;
  byte local_1ad;
  byte local_1ac;
  byte local_1ab;
  byte local_1aa;
  byte local_1a9;
  ulong local_190;
  ulong local_170;
  elemental_vector local_138;
  void *local_128;
  unsigned_short *puStack_120;
  uchar *local_110;
  uint local_108;
  long local_e8;
  long local_e0;
  unsigned_short *local_d8;
  ulong local_d0;
  symbol_codec local_c8;
  
  remapping = *(vector<unsigned_short> **)((long)pData_ptr + 0x18);
  uVar5 = *(ushort *)((long)pData_ptr + 0x10);
  uVar15 = (ulong)uVar5;
  uVar18 = remapping->m_size;
  if (uVar18 != uVar5) {
    if (uVar18 <= uVar5) {
      uVar19 = (uint)uVar5;
      if (remapping->m_capacity < uVar19) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)remapping,uVar19,uVar18 + 1 == uVar19,2,(object_mover)0x0,
                   false);
        uVar18 = remapping->m_size;
      }
      memset(remapping->m_p + uVar18,0,(ulong)(uVar19 - uVar18) * 2);
    }
    remapping->m_size = (uint)uVar5;
  }
  if (data == 0) {
    lVar13 = *pData_ptr;
    local_c8.m_pDecode_buf = (uint8 *)0x0;
    local_c8.m_pDecode_buf_next = (uint8 *)0x0;
    if (uVar5 != 0) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_c8,(uint)uVar5,uVar5 == 1,8,
                 vector<crnlib::optimize_color_params::unpacked_endpoint>::object_mover,false);
      local_c8.m_pDecode_buf_next = (uint8 *)CONCAT44(local_c8.m_pDecode_buf_next._4_4_,(uint)uVar5)
      ;
      local_128 = (void *)0x0;
      puStack_120 = (unsigned_short *)0x0;
      uVar18 = (uint)uVar5;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_128,uVar18,uVar5 == 1,2,(object_mover)0x0,false);
      uVar14 = 0;
      memset((void *)(((ulong)puStack_120 & 0xffffffff) * 2 + (long)local_128),0,
             (ulong)(uVar18 - (uint)puStack_120) * 2);
      puStack_120 = (unsigned_short *)CONCAT44(puStack_120._4_4_,uVar18);
      do {
        local_c8.m_pDecode_buf[uVar14 * 8] = *(uint8 *)(lVar13 + uVar14 * 8);
        local_c8.m_pDecode_buf[uVar14 * 8 + 1] = *(uint8 *)(lVar13 + 1 + uVar14 * 8);
        local_c8.m_pDecode_buf[uVar14 * 8 + 2] = *(uint8 *)(lVar13 + 2 + uVar14 * 8);
        local_c8.m_pDecode_buf[uVar14 * 8 + 3] = *(uint8 *)(lVar13 + 3 + uVar14 * 8);
        local_c8.m_pDecode_buf[uVar14 * 8 + 4] = *(uint8 *)(lVar13 + 4 + uVar14 * 8);
        local_c8.m_pDecode_buf[uVar14 * 8 + 5] = *(uint8 *)(lVar13 + 5 + uVar14 * 8);
        local_c8.m_pDecode_buf[uVar14 * 8 + 6] = *(uint8 *)(lVar13 + 6 + uVar14 * 8);
        local_c8.m_pDecode_buf[uVar14 * 8 + 7] = *(uint8 *)(lVar13 + 7 + uVar14 * 8);
        *(short *)((long)local_128 + uVar14 * 2) = (short)uVar14;
        uVar14 = uVar14 + 1;
      } while (uVar15 != uVar14);
      bVar17 = 0;
      bVar21 = 0;
      bVar22 = 0;
      uVar18 = 0;
      uVar19 = 0;
      bVar25 = 0;
      uVar14 = uVar15;
      do {
        uVar27 = 0xffffffff;
        uVar16 = 0;
        uVar26 = 0;
        do {
          uVar31 = ((uint)local_c8.m_pDecode_buf[uVar16 * 8 + 6] - (uint)bVar25) *
                   ((uint)local_c8.m_pDecode_buf[uVar16 * 8 + 6] - (uint)bVar25) +
                   (local_c8.m_pDecode_buf[uVar16 * 8 + 5] - uVar19) *
                   (local_c8.m_pDecode_buf[uVar16 * 8 + 5] - uVar19) +
                   (local_c8.m_pDecode_buf[uVar16 * 8 + 4] - uVar18) *
                   (local_c8.m_pDecode_buf[uVar16 * 8 + 4] - uVar18) +
                   ((uint)local_c8.m_pDecode_buf[uVar16 * 8 + 2] - (uint)bVar22) *
                   ((uint)local_c8.m_pDecode_buf[uVar16 * 8 + 2] - (uint)bVar22) +
                   ((uint)local_c8.m_pDecode_buf[uVar16 * 8 + 1] - (uint)bVar21) *
                   ((uint)local_c8.m_pDecode_buf[uVar16 * 8 + 1] - (uint)bVar21) +
                   ((uint)local_c8.m_pDecode_buf[uVar16 * 8] - (uint)bVar17) *
                   ((uint)local_c8.m_pDecode_buf[uVar16 * 8] - (uint)bVar17);
          if (uVar31 < uVar27) {
            uVar27 = uVar31;
            uVar26 = (uint)uVar16;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < uVar14);
        uVar16 = (ulong)((uVar26 & 0xffff) * 8);
        bVar17 = local_c8.m_pDecode_buf[uVar16];
        bVar21 = local_c8.m_pDecode_buf[uVar16 + 1];
        bVar22 = local_c8.m_pDecode_buf[uVar16 + 2];
        uVar18 = (uint)local_c8.m_pDecode_buf[uVar16 + 4];
        uVar19 = (uint)local_c8.m_pDecode_buf[uVar16 + 5];
        bVar25 = local_c8.m_pDecode_buf[uVar16 + 6];
        uVar30 = (ulong)((uVar26 & 0xffff) * 2);
        remapping->m_p[*(ushort *)((long)local_128 + uVar30)] = uVar5 - (short)uVar14;
        *(undefined8 *)(local_c8.m_pDecode_buf + uVar16) =
             *(undefined8 *)(local_c8.m_pDecode_buf + uVar14 * 8 + -8);
        *(undefined2 *)((long)local_128 + uVar30) =
             *(undefined2 *)((long)local_128 + uVar14 * 2 + -2);
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
      if (local_128 != (void *)0x0) {
        crnlib_free(local_128);
      }
      if (local_c8.m_pDecode_buf != (uint8 *)0x0) {
        crnlib_free(local_c8.m_pDecode_buf);
      }
    }
    optimize_color_selectors(this);
    goto LAB_00162719;
  }
  local_d8 = remapping->m_p;
  lVar13 = *pData_ptr;
  local_e8 = *(long *)((long)pData_ptr + 8);
  local_1b6 = *(ushort *)((long)pData_ptr + 0x12);
  uVar14 = (ulong)local_1b6;
  fVar3 = *(float *)((long)pData_ptr + 0x14);
  local_c8.m_pDecode_buf = (uint8 *)0x0;
  local_c8.m_pDecode_buf_next = (uint8 *)0x0;
  uVar18 = (uint)uVar5;
  elemental_vector::increase_capacity
            ((elemental_vector *)&local_c8,uVar18,uVar18 == 1,0x18,vector<Node>::object_mover,false)
  ;
  if (uVar18 != (uint)local_c8.m_pDecode_buf_next) {
    memset(local_c8.m_pDecode_buf + ((ulong)local_c8.m_pDecode_buf_next & 0xffffffff) * 0x18,0,
           (((ulong)(uVar18 - (uint)local_c8.m_pDecode_buf_next) * 0x18 - 0x18) / 0x18) * 0x18 +
           0x18);
  }
  local_c8.m_pDecode_buf_next = (uint8 *)CONCAT44(local_c8.m_pDecode_buf_next._4_4_,uVar18);
  lVar12 = 0;
  uVar16 = 0;
  do {
    *(int *)(local_c8.m_pDecode_buf + lVar12) = (int)uVar16;
    local_c8.m_pDecode_buf[lVar12 + 0x10] = *(uint8 *)(lVar13 + uVar16 * 8);
    local_c8.m_pDecode_buf[lVar12 + 0x11] = *(uint8 *)(lVar13 + 1 + uVar16 * 8);
    local_c8.m_pDecode_buf[lVar12 + 0x12] = *(uint8 *)(lVar13 + 2 + uVar16 * 8);
    local_c8.m_pDecode_buf[lVar12 + 0x13] = *(uint8 *)(lVar13 + 3 + uVar16 * 8);
    local_c8.m_pDecode_buf[lVar12 + 0x14] = *(uint8 *)(lVar13 + 4 + uVar16 * 8);
    local_c8.m_pDecode_buf[lVar12 + 0x15] = *(uint8 *)(lVar13 + 5 + uVar16 * 8);
    local_c8.m_pDecode_buf[lVar12 + 0x16] = *(uint8 *)(lVar13 + 6 + uVar16 * 8);
    local_c8.m_pDecode_buf[lVar12 + 0x17] = *(uint8 *)(lVar13 + 7 + uVar16 * 8);
    uVar16 = uVar16 + 1;
    lVar12 = lVar12 + 0x18;
  } while (uVar15 != uVar16);
  min_new_capacity = uVar18 * 2;
  local_128 = (void *)0x0;
  puStack_120 = (unsigned_short *)0x0;
  elemental_vector::increase_capacity
            ((elemental_vector *)&local_128,min_new_capacity,false,2,(object_mover)0x0,false);
  iVar20 = 0;
  memset((void *)(((ulong)puStack_120 & 0xffffffff) * 2 + (long)local_128),0,
         (ulong)(min_new_capacity - (uint)puStack_120) * 2);
  puStack_120 = (unsigned_short *)CONCAT44(puStack_120._4_4_,min_new_capacity);
  *(ushort *)((long)local_128 + uVar15 * 2) = local_1b6;
  local_1a9 = local_c8.m_pDecode_buf[uVar14 * 0x18 + 0x10];
  local_1b0 = local_c8.m_pDecode_buf[uVar14 * 0x18 + 0x11];
  local_1ab = local_c8.m_pDecode_buf[uVar14 * 0x18 + 0x12];
  local_1ac = local_c8.m_pDecode_buf[uVar14 * 0x18 + 0x14];
  local_1ad = local_c8.m_pDecode_buf[uVar14 * 0x18 + 0x15];
  local_1ae = local_c8.m_pDecode_buf[uVar14 * 0x18 + 0x16];
  uVar18 = uVar5 - 1;
  local_170 = (ulong)uVar18;
  uVar10 = *(undefined8 *)(local_c8.m_pDecode_buf + local_170 * 0x18 + 8);
  *(undefined8 *)(local_c8.m_pDecode_buf + uVar14 * 0x18) =
       *(undefined8 *)(local_c8.m_pDecode_buf + local_170 * 0x18);
  *(undefined8 *)(local_c8.m_pDecode_buf + uVar14 * 0x18 + 8) = uVar10;
  *(undefined8 *)(local_c8.m_pDecode_buf + uVar14 * 0x18 + 0x10) =
       *(undefined8 *)(local_c8.m_pDecode_buf + local_170 * 0x18 + 0x10);
  if (uVar18 == 0) {
    uVar16 = 1;
    uVar14 = 1;
  }
  else {
    local_e0 = (long)(fVar3 * 4000.0 + 4000.0);
    local_190 = (ulong)((uint)local_1b6 * (uint)uVar5);
    bVar32 = true;
    bVar9 = true;
    uVar14 = uVar15;
    uVar16 = uVar15;
    local_1b4 = local_1ae;
    local_1b3 = local_1ad;
    local_1b2 = local_1ac;
    local_1b1 = local_1ab;
    local_1af = local_1a9;
    local_1aa = local_1b0;
    do {
      local_d0 = uVar16;
      uVar30 = 0;
      lVar13 = 0x16;
      uVar16 = 0;
      uVar18 = 0;
      do {
        uVar19 = *(uint *)(local_c8.m_pDecode_buf + lVar13 + -0x16);
        iVar28 = *(int *)(local_c8.m_pDecode_buf + lVar13 + -0x12) +
                 *(int *)(local_e8 + local_190 * 4 + (ulong)uVar19 * 4);
        *(int *)(local_c8.m_pDecode_buf + lVar13 + -0x12) = iVar28;
        if (bVar9) {
          uVar26 = ((uint)local_c8.m_pDecode_buf[lVar13] - (uint)local_1b4) *
                   ((uint)local_c8.m_pDecode_buf[lVar13] - (uint)local_1b4) +
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -1] - (uint)local_1b3) *
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -1] - (uint)local_1b3) +
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -2] - (uint)local_1b2) *
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -2] - (uint)local_1b2) +
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -4] - (uint)local_1b1) *
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -4] - (uint)local_1b1) +
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -5] - (uint)local_1b0) *
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -5] - (uint)local_1b0) +
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -6] - (uint)local_1af) *
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -6] - (uint)local_1af);
          if (3999 < uVar26) {
            uVar26 = 4000;
          }
          *(uint *)(local_c8.m_pDecode_buf + lVar13 + -0xe) = (int)local_e0 - uVar26;
        }
        if (bVar32) {
          uVar26 = ((uint)local_c8.m_pDecode_buf[lVar13] - (uint)local_1ae) *
                   ((uint)local_c8.m_pDecode_buf[lVar13] - (uint)local_1ae) +
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -1] - (uint)local_1ad) *
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -1] - (uint)local_1ad) +
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -2] - (uint)local_1ac) *
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -2] - (uint)local_1ac) +
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -4] - (uint)local_1ab) *
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -4] - (uint)local_1ab) +
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -5] - (uint)local_1aa) *
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -5] - (uint)local_1aa) +
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -6] - (uint)local_1a9) *
                   ((uint)local_c8.m_pDecode_buf[lVar13 + -6] - (uint)local_1a9);
          if (3999 < uVar26) {
            uVar26 = 4000;
          }
          uVar26 = (int)local_e0 - uVar26;
          *(uint *)(local_c8.m_pDecode_buf + lVar13 + -10) = uVar26;
        }
        else {
          uVar26 = *(uint *)(local_c8.m_pDecode_buf + lVar13 + -10);
        }
        if (uVar26 < *(uint *)(local_c8.m_pDecode_buf + lVar13 + -0xe)) {
          uVar26 = *(uint *)(local_c8.m_pDecode_buf + lVar13 + -0xe);
        }
        uVar26 = (iVar28 + iVar20) * uVar26 + 1;
        if ((uVar18 < uVar26) || ((uVar18 == uVar26 && (uVar19 < local_1b6)))) {
          uVar16 = uVar30 & 0xffffffff;
          local_1b6 = (ushort)uVar19;
          uVar18 = uVar26;
        }
        uVar30 = uVar30 + 1;
        lVar13 = lVar13 + 0x18;
      } while (local_170 != uVar30);
      local_190 = (ulong)((uint)local_1b6 * (uint)uVar5);
      iVar28 = (int)uVar14;
      iVar29 = (int)local_d0;
      if (iVar28 - iVar29 == 0 || iVar28 < iVar29) {
        uVar23 = 0;
        uVar30 = 0;
      }
      else {
        lVar13 = local_e8 + local_190 * 4;
        uVar19 = 0;
        uVar26 = 0;
        uVar30 = uVar14;
        uVar23 = local_d0;
        uVar18 = iVar28 - iVar29;
        do {
          uVar26 = uVar26 + *(int *)(lVar13 + (ulong)*(ushort *)((long)local_128 + uVar23 * 2) * 4)
                            * uVar18;
          uVar19 = uVar19 + *(int *)(lVar13 + (ulong)*(ushort *)((long)local_128 + uVar30 * 2) * 4)
                            * uVar18;
          uVar23 = (ulong)((int)uVar23 + 1);
          uVar30 = (ulong)((int)uVar30 - 1);
          bVar32 = 2 < uVar18;
          uVar18 = uVar18 - 2;
        } while (bVar32);
        uVar23 = (ulong)uVar26;
        uVar30 = (ulong)uVar19;
      }
      puVar1 = local_c8.m_pDecode_buf + uVar16 * 0x18;
      iVar20 = *(int *)(puVar1 + 4);
      uVar23 = *(uint *)(puVar1 + 8) * uVar23;
      uVar30 = *(uint *)(puVar1 + 0xc) * uVar30;
      bVar32 = uVar23 - uVar30 == 0;
      bVar9 = uVar23 >= uVar30 && !bVar32;
      if (uVar23 < uVar30 || bVar32) {
        uVar14 = (ulong)(iVar28 + 1);
        *(ushort *)((long)local_128 + uVar14 * 2) = local_1b6;
        local_1a9 = puVar1[0x10];
        local_1aa = puVar1[0x11];
        local_1ab = puVar1[0x12];
        local_1ac = puVar1[0x14];
        local_1ad = puVar1[0x15];
        local_1ae = puVar1[0x16];
        uVar16 = local_d0;
      }
      else {
        *(ushort *)((long)local_128 + (ulong)(iVar29 - 1) * 2) = local_1b6;
        local_1af = puVar1[0x10];
        local_1b0 = puVar1[0x11];
        local_1b1 = puVar1[0x12];
        local_1b2 = puVar1[0x14];
        local_1b3 = puVar1[0x15];
        local_1b4 = puVar1[0x16];
        uVar16 = (ulong)(iVar29 - 1);
      }
      iVar20 = iVar20 << 3;
      bVar32 = uVar23 < uVar30 || uVar23 - uVar30 == 0;
      local_170 = local_170 - 1;
      uVar10 = *(undefined8 *)(local_c8.m_pDecode_buf + local_170 * 0x18 + 8);
      *(undefined8 *)puVar1 = *(undefined8 *)(local_c8.m_pDecode_buf + local_170 * 0x18);
      *(undefined8 *)(puVar1 + 8) = uVar10;
      puVar1[0x10] = local_c8.m_pDecode_buf[local_170 * 0x18 + 0x10];
      puVar1[0x11] = local_c8.m_pDecode_buf[local_170 * 0x18 + 0x11];
      puVar1[0x12] = local_c8.m_pDecode_buf[local_170 * 0x18 + 0x12];
      puVar1[0x13] = local_c8.m_pDecode_buf[local_170 * 0x18 + 0x13];
      puVar1[0x14] = local_c8.m_pDecode_buf[local_170 * 0x18 + 0x14];
      puVar1[0x15] = local_c8.m_pDecode_buf[local_170 * 0x18 + 0x15];
      puVar1[0x16] = local_c8.m_pDecode_buf[local_170 * 0x18 + 0x16];
      puVar1[0x17] = local_c8.m_pDecode_buf[local_170 * 0x18 + 0x17];
    } while (local_170 != 0);
  }
  if ((uint)uVar14 < ((uint)uVar16 & 0xffff)) {
    if (local_128 != (void *)0x0) goto LAB_00162702;
  }
  else {
    uVar11 = 0;
    do {
      local_d8[*(ushort *)((long)local_128 + (uVar16 & 0xffff) * 2)] = uVar11;
      uVar18 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar18;
      uVar11 = uVar11 + 1;
    } while ((uVar18 & 0xffff) <= (uint)uVar14);
LAB_00162702:
    crnlib_free(local_128);
  }
  if (local_c8.m_pDecode_buf != (uint8 *)0x0) {
    crnlib_free(local_c8.m_pDecode_buf);
  }
LAB_00162719:
  packed_data = (vector<unsigned_char> *)(*(long *)((long)pData_ptr + 0x18) + 0x10);
  if (this->m_has_etc_color_blocks == true) {
    pack_color_endpoints_etc(this,packed_data,remapping);
  }
  else {
    pack_color_endpoints(this,packed_data,remapping);
  }
  iVar20 = *(int *)(*(long *)((long)pData_ptr + 0x18) + 0x18);
  local_138.m_p = (void *)0x0;
  local_138.m_size = 0;
  local_138.m_capacity = 0;
  if (uVar15 != 0) {
    elemental_vector::increase_capacity(&local_138,(uint)uVar5,uVar5 == 1,4,(object_mover)0x0,false)
    ;
    memset((void *)((local_138._8_8_ & 0xffffffff) * 4 + (long)local_138.m_p),0,
           (ulong)(uVar5 - local_138.m_size) << 2);
    local_138.m_size = (uint)uVar5;
  }
  uVar18 = (this->m_levels).m_size;
  if (uVar18 != 0) {
    uVar14 = 0;
    do {
      plVar7 = (this->m_levels).m_p;
      uVar19 = plVar7[uVar14].first_block;
      uVar16 = (ulong)uVar19;
      uVar26 = plVar7[uVar14].num_blocks + uVar19;
      if (uVar19 < uVar26) {
        uVar18 = 0;
        do {
          peVar8 = (this->m_endpoint_indices).m_p;
          uVar6 = remapping->m_p[peVar8[uVar16].field_0.field_0.color];
          uVar4 = peVar8[uVar16].reference;
          uVar24 = uVar4;
          if (this->m_has_subblocks == false) {
            uVar24 = uVar4 == '\0';
          }
          if ((uVar16 & 1) == 0) {
            uVar24 = uVar4 == '\0';
          }
          if (uVar24 != '\0') {
            iVar28 = uVar6 - uVar18;
            piVar2 = (int *)((long)local_138.m_p +
                            (ulong)((iVar28 >> 0x1f & (uint)uVar5) + iVar28) * 4);
            *piVar2 = *piVar2 + 1;
          }
          uVar16 = uVar16 + 1;
          uVar18 = (uint)uVar6;
        } while (uVar26 != uVar16);
        uVar18 = (this->m_levels).m_size;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < uVar18);
  }
  static_huffman_data_model::static_huffman_data_model((static_huffman_data_model *)&local_128);
  static_huffman_data_model::init((static_huffman_data_model *)&local_128,(EVP_PKEY_CTX *)0x1);
  if (local_108 == 0) {
    local_110 = (uchar *)0x0;
  }
  iVar20 = iVar20 << 3;
  if (uVar5 != 0) {
    uVar14 = 0;
    do {
      iVar20 = iVar20 + (uint)local_110[uVar14] * *(int *)((long)local_138.m_p + uVar14 * 4);
      uVar14 = uVar14 + 1;
    } while (uVar15 != uVar14);
  }
  symbol_codec::symbol_codec(&local_c8);
  symbol_codec::start_encoding(&local_c8,0x10000);
  local_c8.m_simulate_encoding = true;
  symbol_codec::encode_transmit_static_huffman_data_model
            (&local_c8,(static_huffman_data_model *)&local_128,false,
             (static_huffman_data_model *)0x0);
  symbol_codec::stop_encoding(&local_c8,false);
  *(uint *)(*(long *)((long)pData_ptr + 0x18) + 0x20) = iVar20 + local_c8.m_total_bits_written;
  crnlib_free(pData_ptr);
  if (local_c8.m_output_syms.m_p != (output_symbol *)0x0) {
    crnlib_free(local_c8.m_output_syms.m_p);
  }
  if (local_c8.m_arith_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_c8.m_arith_output_buf.m_p);
  }
  if (local_c8.m_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_c8.m_output_buf.m_p);
  }
  static_huffman_data_model::~static_huffman_data_model((static_huffman_data_model *)&local_128);
  if (local_138.m_p != (void *)0x0) {
    crnlib_free(local_138.m_p);
  }
  return;
}

Assistant:

void crn_comp::optimize_color_endpoints_task(uint64 data, void* pData_ptr) {
  optimize_color_params* pParams = reinterpret_cast<optimize_color_params*>(pData_ptr);
  crnlib::vector<uint16>& remapping = pParams->pResult->endpoint_remapping;
  uint16 n = pParams->n;
  remapping.resize(n);

  if (data) {
    remap_color_endpoints(remapping.get_ptr(), pParams->unpacked_endpoints, pParams->hist, n, pParams->selected, pParams->weight);
  } else {
    sort_color_endpoints(remapping, pParams->unpacked_endpoints, n);
    optimize_color_selectors();
  }

  m_has_etc_color_blocks ? pack_color_endpoints_etc(pParams->pResult->packed_endpoints, remapping) : pack_color_endpoints(pParams->pResult->packed_endpoints, remapping);
  uint total_bits = pParams->pResult->packed_endpoints.size() << 3;

  crnlib::vector<uint> hist(n);
  for (uint level = 0; level < m_levels.size(); level++) {
    for (uint endpoint_index = 0, b = m_levels[level].first_block, bEnd = b + m_levels[level].num_blocks; b < bEnd; b++) {
      uint index = remapping[m_endpoint_indices[b].component[cColor]];
      if (m_has_subblocks && b & 1 ? m_endpoint_indices[b].reference : !m_endpoint_indices[b].reference) {
        int sym = index - endpoint_index;
        hist[sym < 0 ? sym + n : sym]++;
      }
      endpoint_index = index;
    }
  }

  static_huffman_data_model dm;
  dm.init(true, n, hist.get_ptr(), 16);
  const uint8* code_sizes = dm.get_code_sizes();
  for (uint16 s = 0; s < n; s++)
    total_bits += hist[s] * code_sizes[s];

  symbol_codec codec;
  codec.start_encoding(64 * 1024);
  codec.encode_enable_simulation(true);
  codec.encode_transmit_static_huffman_data_model(dm, false);
  codec.stop_encoding(false);
  total_bits += codec.encode_get_total_bits_written();

  pParams->pResult->total_bits = total_bits;

  crnlib_delete(pParams);
}